

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall Parser::error<char_const(&)[51]>(Parser *this,char (*args) [51])

{
  Token *pTVar1;
  pointer pcVar2;
  char buf [4096];
  
  sprintf(buf,*args);
  pTVar1 = this->tok;
  pcVar2 = (this->lex_data->fn)._M_dataplus._M_p;
  if (pTVar1 == (Token *)0x0) {
    printf("%s: %s\n",pcVar2,buf);
  }
  else {
    printf("%s:%d:%d: %s\n",pcVar2,(ulong)(uint)(pTVar1->pos).line,(ulong)(uint)(pTVar1->pos).col,
           buf);
  }
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    if (tok) {
      std::printf("%s:%d:%d: %s\n",
                  lex_data->fn.c_str(),
                  tok->pos.line,
                  tok->pos.col,
                  buf);
    }
    else {
      std::printf("%s: %s\n",
                  lex_data->fn.c_str(),
                  buf);
    }
    std::exit(1);
  }